

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa.c
# Opt level: O3

void * soa_alloc(soa_t *allocator,size_t size)

{
  void *pvVar1;
  soa_fsa_t *allocator_00;
  
  if (0x1f < size - 1) {
    __assert_fail("(size<=SOA_SMALL_OBJECT_MAX_SIZE) && (size>0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa.c"
                  ,0x46,"void *soa_alloc(soa_t *, size_t)");
  }
  allocator_00 = allocator->fsa[size - 1];
  if (allocator_00 == (soa_fsa_t *)0x0) {
    soa_initFSA(allocator,size,0xff);
    allocator_00 = allocator->fsa[size - 1];
    if (allocator_00 == (soa_fsa_t *)0x0) {
      __assert_fail("allocator->fsa[size-1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa.c"
                    ,0x4e,"void *soa_alloc(soa_t *, size_t)");
    }
  }
  pvVar1 = soa_fsa_alloc(allocator_00);
  return pvVar1;
}

Assistant:

void * soa_alloc( soa_t *allocator, size_t size )
{
  assert((size<=SOA_SMALL_OBJECT_MAX_SIZE) && (size>0)) ;
#if(AUTO_INITIALIZE_FSA)
  if(allocator->fsa[size-1] == 0)
  {
    soa_initFSA(allocator,size,DEFAULT_NUM_BLOCKS);
  }
#endif
  
  assert(allocator->fsa[size-1]);
  return soa_fsa_alloc(allocator->fsa[size-1]);
}